

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

int DSA_generate_parameters_ex
              (DSA *dsa,uint bits,uint8_t *seed_in,size_t seed_len,int *out_counter,
              unsigned_long *out_h,BN_GENCB *cb)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t i;
  EVP_MD *md_00;
  undefined4 extraout_var;
  tuple<bignum_ctx_*,_bssl::internal::Deleter> ctx_00;
  BIGNUM *pBVar7;
  BIGNUM *r;
  BIGNUM *pBVar8;
  BIGNUM *ret;
  BIGNUM *a;
  BIGNUM *rem;
  BIGNUM *r_00;
  BIGNUM *r_01;
  BIGNUM *pBVar9;
  ulong uVar10;
  tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter> m_ctx;
  uint uVar11;
  bool bVar12;
  int local_124;
  UniquePtr<BN_MONT_CTX> mont;
  UniquePtr<BN_CTX> ctx;
  uchar md [32];
  uchar buf [32];
  uchar seed [32];
  uchar buf2 [32];
  ulong __n;
  
  if (10000 < bits) {
    ERR_put_error(10,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0xaa);
    return 0;
  }
  if (bits < 0x800) {
    md_00 = EVP_sha1();
  }
  else {
    md_00 = EVP_sha256();
  }
  iVar2 = EVP_MD_size(md_00);
  __n = CONCAT44(extraout_var,iVar2);
  uVar11 = 0x200;
  if (0x200 < bits) {
    uVar11 = bits;
  }
  bVar12 = seed_in == (uint8_t *)0x0;
  if (!bVar12) {
    if (seed_len < __n) {
      return 0;
    }
    if (__n != 0) {
      memcpy(seed,seed_in,__n);
    }
  }
  ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>)BN_CTX_new();
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
       ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
  if (ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_ctx_*,_false>)0x0) {
    iVar4 = 0;
    goto LAB_002ced10;
  }
  BN_CTX_start((BN_CTX *)
               ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  pBVar7 = BN_CTX_get((BN_CTX *)
                      ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  r = BN_CTX_get((BN_CTX *)
                 ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  pBVar8 = BN_CTX_get((BN_CTX *)
                      ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  ret = BN_CTX_get((BN_CTX *)
                   ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  a = BN_CTX_get((BN_CTX *)
                 ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  rem = BN_CTX_get((BN_CTX *)
                   ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  r_00 = BN_CTX_get((BN_CTX *)
                    ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  r_01 = BN_CTX_get((BN_CTX *)
                    ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  iVar4 = 0;
  if (r_01 != (BIGNUM *)0x0) {
    pBVar9 = BN_value_one();
    uVar11 = (uVar11 + 0x3f & 0x7fc0) - 1;
    iVar3 = BN_lshift(r_01,pBVar9,uVar11);
    if (iVar3 != 0) {
      local_124 = 0;
LAB_002ce972:
      do {
        iVar4 = BN_GENCB_call((BN_GENCB *)cb,0,local_124);
        if ((iVar4 == 0) || ((bVar12 != false && (iVar4 = RAND_bytes(seed,iVar2), iVar4 == 0)))) {
          iVar4 = 0;
          break;
        }
        if (__n != 0) {
          memcpy(buf,seed,__n);
          memcpy(buf2,seed,__n);
        }
        local_124 = local_124 + 1;
        uVar10 = __n - 1;
        do {
          if (__n <= uVar10) break;
          puVar1 = buf + uVar10;
          *puVar1 = *puVar1 + '\x01';
          uVar10 = uVar10 - 1;
        } while (*puVar1 == '\0');
        iVar3 = EVP_Digest(seed,__n,md,(uint *)0x0,md_00,(ENGINE *)0x0);
        iVar4 = 0;
        if (iVar3 == 0) break;
        iVar3 = EVP_Digest(buf,__n,buf2,(uint *)0x0,md_00,(ENGINE *)0x0);
        iVar4 = 0;
        if (iVar3 == 0) break;
        for (uVar10 = 0; __n != uVar10; uVar10 = uVar10 + 1) {
          md[uVar10] = md[uVar10] ^ buf2[uVar10];
        }
        md[0] = md[0] | 0x80;
        md[__n - 1] = md[__n - 1] | 1;
        pBVar9 = BN_bin2bn(md,iVar2,ret);
        iVar4 = 0;
        if (pBVar9 == (BIGNUM *)0x0) break;
        iVar3 = BN_is_prime_fasttest_ex
                          (ret,0x32,(BN_CTX *)
                                    ctx_00.
                                    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                           (uint)bVar12,(BN_GENCB *)cb);
        if (0 < iVar3) {
          iVar3 = BN_GENCB_call((BN_GENCB *)cb,2,0);
          iVar4 = 0;
          if (iVar3 == 0) break;
          iVar3 = BN_GENCB_call((BN_GENCB *)cb,3,0);
          iVar4 = 0;
          if (iVar3 == 0) break;
          iVar3 = 0;
          do {
            if (iVar3 != 0) {
              iVar5 = BN_GENCB_call((BN_GENCB *)cb,0,iVar3);
              iVar4 = 0;
              if (iVar5 == 0) goto LAB_002ced06;
            }
            BN_zero((BIGNUM *)pBVar8);
            iVar5 = 0;
            while (uVar10 = __n - 1, iVar5 != uVar11 / 0xa0 + 1) {
              do {
                if (__n <= uVar10) break;
                puVar1 = buf + uVar10;
                *puVar1 = *puVar1 + '\x01';
                uVar10 = uVar10 - 1;
              } while (*puVar1 == '\0');
              iVar4 = 0;
              iVar6 = EVP_Digest(buf,__n,md,(uint *)0x0,md_00,(ENGINE *)0x0);
              if (((iVar6 == 0) || (pBVar9 = BN_bin2bn(md,iVar2,pBVar7), pBVar9 == (BIGNUM *)0x0))
                 || (iVar6 = BN_lshift(pBVar7,pBVar7,iVar2 * 8 * iVar5), iVar6 == 0))
              goto LAB_002ced06;
              iVar6 = BN_add(pBVar8,pBVar8,pBVar7);
              iVar5 = iVar5 + 1;
              if (iVar6 == 0) goto LAB_002ced06;
            }
            iVar5 = BN_mask_bits(pBVar8,uVar11);
            iVar4 = 0;
            if (((iVar5 == 0) || (pBVar9 = BN_copy(a,pBVar8), pBVar9 == (BIGNUM *)0x0)) ||
               ((iVar5 = BN_add(a,a,r_01), iVar5 == 0 ||
                (iVar5 = BN_lshift1(pBVar7,ret), iVar5 == 0)))) goto LAB_002ced06;
            iVar4 = 0;
            iVar5 = BN_div((BIGNUM *)0x0,rem,a,pBVar7,
                           (BN_CTX *)
                           ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
            if (iVar5 == 0) goto LAB_002ced06;
            pBVar9 = BN_value_one();
            iVar5 = BN_sub(pBVar7,rem,pBVar9);
            if ((iVar5 == 0) || (iVar5 = BN_sub(r_00,a,pBVar7), iVar5 == 0)) goto LAB_002ced06;
            iVar5 = BN_cmp(r_00,r_01);
            if (-1 < iVar5) {
              iVar5 = BN_is_prime_fasttest_ex
                                (r_00,0x32,
                                 (BN_CTX *)
                                 ctx_00.
                                 super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,1,
                                 (BN_GENCB *)cb);
              if (0 < iVar5) {
                uVar11 = 2;
                iVar2 = BN_GENCB_call((BN_GENCB *)cb,2,1);
                if (iVar2 == 0) goto LAB_002ced06;
                pBVar8 = BN_value_one();
                iVar2 = BN_sub(r_01,r_00,pBVar8);
                if (iVar2 == 0) goto LAB_002ced06;
                iVar2 = BN_div(pBVar7,(BIGNUM *)0x0,r_01,ret,
                               (BN_CTX *)
                               ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                iVar4 = 0;
                if (iVar2 == 0) goto LAB_002ced06;
                m_ctx.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>)
                     BN_MONT_CTX_new_for_modulus
                               ((BIGNUM *)r_00,
                                (BN_CTX *)
                                ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                iVar2 = 0;
                iVar5 = 0;
                iVar4 = iVar2;
                mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
                     m_ctx.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl;
                if ((m_ctx.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
                     (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0) ||
                   (iVar6 = BN_set_word(r_01,2), iVar6 == 0)) goto LAB_002ceed5;
                goto LAB_002cedcf;
              }
              if (iVar5 != 0) goto LAB_002ced06;
            }
            iVar3 = iVar3 + 1;
            bVar12 = true;
          } while (iVar3 != 0x1000);
          goto LAB_002ce972;
        }
        bVar12 = true;
      } while (iVar3 == 0);
    }
  }
LAB_002ced06:
  BN_CTX_end((BN_CTX *)
             ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
LAB_002ced10:
  std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return iVar4;
LAB_002cedcf:
  iVar6 = BN_mod_exp_mont(r,r_01,pBVar7,r_00,
                          (BN_CTX *)
                          ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                          (BN_MONT_CTX *)
                          m_ctx.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl);
  iVar4 = iVar2;
  if (iVar6 == 0) goto LAB_002ceed5;
  iVar6 = BN_is_one((BIGNUM *)r);
  iVar4 = iVar5;
  if (iVar6 == 0) {
    iVar2 = BN_GENCB_call((BN_GENCB *)cb,3,1);
    if (iVar2 != 0) {
      BN_free((BIGNUM *)dsa->p);
      BN_free((BIGNUM *)dsa->q);
      BN_free((BIGNUM *)dsa->g);
      pBVar7 = BN_dup(r_00);
      dsa->p = (BIGNUM *)pBVar7;
      pBVar7 = BN_dup(ret);
      dsa->q = (BIGNUM *)pBVar7;
      pBVar7 = BN_dup(r);
      dsa->g = (BIGNUM *)pBVar7;
      if ((dsa->p != (BIGNUM *)0x0) && (pBVar7 != (BIGNUM *)0x0 && dsa->q != (BIGNUM *)0x0)) {
        if (out_counter != (int *)0x0) {
          *out_counter = iVar3;
        }
        iVar4 = 1;
        if (out_h != (unsigned_long *)0x0) {
          *out_h = (ulong)uVar11;
        }
      }
    }
    goto LAB_002ceed5;
  }
  pBVar8 = BN_value_one();
  iVar6 = BN_add(r_01,r_01,pBVar8);
  if (iVar6 == 0) goto LAB_002ceed5;
  uVar11 = uVar11 + 1;
  goto LAB_002cedcf;
LAB_002ceed5:
  std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&mont);
  goto LAB_002ced06;
}

Assistant:

int DSA_generate_parameters_ex(DSA *dsa, unsigned bits, const uint8_t *seed_in,
                               size_t seed_len, int *out_counter,
                               unsigned long *out_h, BN_GENCB *cb) {
  if (bits > OPENSSL_DSA_MAX_MODULUS_BITS) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
    return 0;
  }

  unsigned char seed[SHA256_DIGEST_LENGTH];
  unsigned char md[SHA256_DIGEST_LENGTH];
  unsigned char buf[SHA256_DIGEST_LENGTH], buf2[SHA256_DIGEST_LENGTH];
  BIGNUM *r0, *W, *X, *c, *test;
  BIGNUM *g = NULL, *q = NULL, *p = NULL;
  int k, n = 0, m = 0;
  int counter = 0;
  int r = 0;
  unsigned int h = 2;
  const EVP_MD *evpmd;

  evpmd = (bits >= 2048) ? EVP_sha256() : EVP_sha1();
  size_t qsize = EVP_MD_size(evpmd);

  if (bits < 512) {
    bits = 512;
  }

  bits = (bits + 63) / 64 * 64;

  if (seed_in != NULL) {
    if (seed_len < qsize) {
      return 0;
    }
    if (seed_len > qsize) {
      // Only consume as much seed as is expected.
      seed_len = qsize;
    }
    OPENSSL_memcpy(seed, seed_in, seed_len);
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }
  bssl::BN_CTXScope scope(ctx.get());

  r0 = BN_CTX_get(ctx.get());
  g = BN_CTX_get(ctx.get());
  W = BN_CTX_get(ctx.get());
  q = BN_CTX_get(ctx.get());
  X = BN_CTX_get(ctx.get());
  c = BN_CTX_get(ctx.get());
  p = BN_CTX_get(ctx.get());
  test = BN_CTX_get(ctx.get());

  if (test == NULL || !BN_lshift(test, BN_value_one(), bits - 1)) {
    return 0;
  }

  for (;;) {
    // Find q.
    for (;;) {
      // step 1
      if (!BN_GENCB_call(cb, BN_GENCB_GENERATED, m++)) {
        return 0;
      }

      int use_random_seed = (seed_in == NULL);
      if (use_random_seed) {
        if (!RAND_bytes(seed, qsize)) {
          return 0;
        }
        // DSA parameters are public.
        CONSTTIME_DECLASSIFY(seed, qsize);
      } else {
        // If we come back through, use random seed next time.
        seed_in = NULL;
      }
      OPENSSL_memcpy(buf, seed, qsize);
      OPENSSL_memcpy(buf2, seed, qsize);
      // precompute "SEED + 1" for step 7:
      for (size_t i = qsize - 1; i < qsize; i--) {
        buf[i]++;
        if (buf[i] != 0) {
          break;
        }
      }

      // step 2
      if (!EVP_Digest(seed, qsize, md, NULL, evpmd, NULL) ||
          !EVP_Digest(buf, qsize, buf2, NULL, evpmd, NULL)) {
        return 0;
      }
      for (size_t i = 0; i < qsize; i++) {
        md[i] ^= buf2[i];
      }

      // step 3
      md[0] |= 0x80;
      md[qsize - 1] |= 0x01;
      if (!BN_bin2bn(md, qsize, q)) {
        return 0;
      }

      // step 4
      r = BN_is_prime_fasttest_ex(q, DSS_prime_checks, ctx.get(),
                                  use_random_seed, cb);
      if (r > 0) {
        break;
      }
      if (r != 0) {
        return 0;
      }

      // do a callback call
      // step 5
    }

    if (!BN_GENCB_call(cb, 2, 0) || !BN_GENCB_call(cb, 3, 0)) {
      return 0;
    }

    // step 6
    counter = 0;
    // "offset = 2"

    n = (bits - 1) / 160;

    for (;;) {
      if ((counter != 0) && !BN_GENCB_call(cb, BN_GENCB_GENERATED, counter)) {
        return 0;
      }

      // step 7
      BN_zero(W);
      // now 'buf' contains "SEED + offset - 1"
      for (k = 0; k <= n; k++) {
        // obtain "SEED + offset + k" by incrementing:
        for (size_t i = qsize - 1; i < qsize; i--) {
          buf[i]++;
          if (buf[i] != 0) {
            break;
          }
        }

        if (!EVP_Digest(buf, qsize, md, NULL, evpmd, NULL)) {
          return 0;
        }

        // step 8
        if (!BN_bin2bn(md, qsize, r0) || !BN_lshift(r0, r0, (qsize << 3) * k) ||
            !BN_add(W, W, r0)) {
          return 0;
        }
      }

      // more of step 8
      if (!BN_mask_bits(W, bits - 1) || !BN_copy(X, W) || !BN_add(X, X, test)) {
        return 0;
      }

      // step 9
      if (!BN_lshift1(r0, q) || !BN_mod(c, X, r0, ctx.get()) ||
          !BN_sub(r0, c, BN_value_one()) || !BN_sub(p, X, r0)) {
        return 0;
      }

      // step 10
      if (BN_cmp(p, test) >= 0) {
        // step 11
        r = BN_is_prime_fasttest_ex(p, DSS_prime_checks, ctx.get(), 1, cb);
        if (r > 0) {
          goto end;  // found it
        }
        if (r != 0) {
          return 0;
        }
      }

      // step 13
      counter++;
      // "offset = offset + n + 1"

      // step 14
      if (counter >= 4096) {
        break;
      }
    }
  }
end:
  if (!BN_GENCB_call(cb, 2, 1)) {
    return 0;
  }

  // We now need to generate g
  // Set r0=(p-1)/q
  if (!BN_sub(test, p, BN_value_one()) ||
      !BN_div(r0, NULL, test, q, ctx.get())) {
    return 0;
  }

  bssl::UniquePtr<BN_MONT_CTX> mont(BN_MONT_CTX_new_for_modulus(p, ctx.get()));
  if (mont == nullptr || !BN_set_word(test, h)) {
    return 0;
  }

  for (;;) {
    // g=test^r0%p
    if (!BN_mod_exp_mont(g, test, r0, p, ctx.get(), mont.get())) {
      return 0;
    }
    if (!BN_is_one(g)) {
      break;
    }
    if (!BN_add(test, test, BN_value_one())) {
      return 0;
    }
    h++;
  }

  if (!BN_GENCB_call(cb, 3, 1)) {
    return 0;
  }

  BN_free(dsa->p);
  BN_free(dsa->q);
  BN_free(dsa->g);
  dsa->p = BN_dup(p);
  dsa->q = BN_dup(q);
  dsa->g = BN_dup(g);
  if (dsa->p == NULL || dsa->q == NULL || dsa->g == NULL) {
    return 0;
  }
  if (out_counter != NULL) {
    *out_counter = counter;
  }
  if (out_h != NULL) {
    *out_h = h;
  }

  return 1;
}